

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O1

void __thiscall
embree::BVHN<4>::set(BVHN<4> *this,NodeRef root,LBBox3fa *bounds,size_t numPrimitives)

{
  undefined8 uVar1;
  
  (this->root).ptr = root.ptr;
  uVar1 = *(undefined8 *)((long)&(bounds->bounds0).lower.field_0 + 8);
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.lower.field_0 =
       *(undefined8 *)&(bounds->bounds0).lower.field_0;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.lower.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(bounds->bounds0).upper.field_0 + 8);
  *(undefined8 *)&(this->super_AccelData).bounds.bounds0.upper.field_0 =
       *(undefined8 *)&(bounds->bounds0).upper.field_0;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds0.upper.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(bounds->bounds1).lower.field_0 + 8);
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.lower.field_0 =
       *(undefined8 *)&(bounds->bounds1).lower.field_0;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.lower.field_0 + 8) = uVar1;
  uVar1 = *(undefined8 *)((long)&(bounds->bounds1).upper.field_0 + 8);
  *(undefined8 *)&(this->super_AccelData).bounds.bounds1.upper.field_0 =
       *(undefined8 *)&(bounds->bounds1).upper.field_0;
  *(undefined8 *)((long)&(this->super_AccelData).bounds.bounds1.upper.field_0 + 8) = uVar1;
  this->numPrimitives = numPrimitives;
  return;
}

Assistant:

void BVHN<N>::set (NodeRef root, const LBBox3fa& bounds, size_t numPrimitives)
  {
    this->root = root;
    this->bounds = bounds;
    this->numPrimitives = numPrimitives;
  }